

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_strand_array.h
# Opt level: O2

Split * __thiscall
embree::sse2::HeuristicStrandSplit::find
          (Split *__return_storage_ptr__,HeuristicStrandSplit *this,range<unsigned_long> *set,
          size_t logBlockSize)

{
  uint uVar1;
  uint uVar2;
  Geometry *pGVar3;
  PrimRef *pPVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  byte bVar12;
  unsigned_long uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  undefined1 auVar22 [12];
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar30 [12];
  vfloat4 a_1;
  float fVar33;
  float fVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar35;
  float fVar36;
  vfloat4 a;
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  vfloat4 a0;
  undefined1 local_128 [8];
  float fStack_120;
  vfloat4 a0_1;
  long local_100;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  undefined1 local_e8 [8];
  float fStack_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  LinearSpace3fa space0;
  LinearSpace3fa space1;
  
  uVar13 = set->_begin;
  uVar17 = uVar13 << 5 | 0x1c;
  uVar16 = 0xffffffffffffffff;
  a0.field_0.v[0] = 0.0;
  a0.field_0.v[1] = 0.0;
  a0.field_0.i[2] = 0x3f800000;
  a0.field_0.v[3] = 0.0;
  for (; uVar14 = set->_end, uVar13 < uVar14; uVar13 = uVar13 + 1) {
    uVar1 = *(uint *)((long)this->prims + (uVar17 - 0x10));
    uVar14 = CONCAT44(*(undefined4 *)((long)&(this->prims->lower).field_0 + uVar17),uVar1);
    if (uVar14 < uVar16) {
      (*(((this->scene->geometries).items[uVar1].ptr)->super_RefCount)._vptr_RefCount[0x37])
                (&space0);
      fVar27 = space0.vx.field_0.m128[1] * space0.vx.field_0.m128[1];
      fVar28 = space0.vx.field_0.m128[2] * space0.vx.field_0.m128[2];
      fVar29 = space0.vx.field_0.m128[3] * space0.vx.field_0.m128[3];
      fVar20 = fVar27 + space0.vx.field_0.m128[0] * space0.vx.field_0.m128[0] + fVar28;
      fVar21 = fVar27 + fVar27 + fVar29;
      fVar28 = fVar27 + fVar28 + fVar28;
      fVar29 = fVar27 + fVar29 + fVar29;
      if (1e-18 < fVar20) {
        auVar23._4_4_ = fVar21;
        auVar23._0_4_ = fVar20;
        auVar23._8_4_ = fVar28;
        auVar23._12_4_ = fVar29;
        auVar24._4_4_ = fVar21;
        auVar24._0_4_ = fVar20;
        auVar24._8_4_ = fVar28;
        auVar24._12_4_ = fVar29;
        auVar24 = rsqrtss(auVar23,auVar24);
        fVar21 = auVar24._0_4_;
        fVar20 = fVar21 * fVar21 * fVar20 * -0.5 * fVar21 + fVar21 * 1.5;
        a0.field_0.v[0] = space0.vx.field_0.m128[0] * fVar20;
        a0.field_0.v[1] = space0.vx.field_0.m128[1] * fVar20;
        a0.field_0.v[2] = space0.vx.field_0.m128[2] * fVar20;
        a0.field_0.v[3] = space0.vx.field_0.m128[3] * fVar20;
        uVar16 = uVar14;
      }
    }
    uVar17 = uVar17 + 0x20;
  }
  uVar13 = set->_begin;
  uVar17 = uVar13 << 5 | 0x1c;
  uVar16 = 0xffffffffffffffff;
  local_128._0_4_ = 1.0;
  a0_1.field_0.v[1] = (float)a0.field_0.i[1];
  a0_1.field_0.v[0] = (float)a0.field_0.i[0];
  a0_1.field_0.v[3] = (float)a0.field_0.i[3];
  a0_1.field_0.v[2] = (float)a0.field_0.i[2];
  for (; uVar13 < uVar14; uVar13 = uVar13 + 1) {
    uVar1 = *(uint *)((long)this->prims + (uVar17 - 0x10));
    uVar2 = *(uint *)((long)&(this->prims->lower).field_0 + uVar17);
    pGVar3 = (this->scene->geometries).items[uVar1].ptr;
    (*(pGVar3->super_RefCount)._vptr_RefCount[0x37])(&space0,pGVar3,(ulong)uVar2);
    fVar20 = SQRT(space0.vx.field_0._8_4_ * space0.vx.field_0._8_4_ +
                  space0.vx.field_0._4_4_ * space0.vx.field_0._4_4_ +
                  space0.vx.field_0._0_4_ * space0.vx.field_0._0_4_);
    if ((fVar20 != 0.0) || (NAN(fVar20))) {
      uVar14 = CONCAT44(uVar2,uVar1);
      auVar5._4_4_ = fVar20;
      auVar5._0_4_ = fVar20;
      auVar5._8_4_ = fVar20;
      auVar5._12_4_ = fVar20;
      aVar18 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
               divps((undefined1  [16])space0.vx.field_0,auVar5);
      fVar20 = ABS(a0.field_0.v[2] * aVar18.v[2] +
                   a0.field_0.v[1] * aVar18.v[1] + a0.field_0.v[0] * aVar18.v[0]);
      if ((fVar20 < (float)local_128._0_4_) || (fVar20 == (float)local_128._0_4_ && uVar14 < uVar16)
         ) {
        uVar16 = uVar14;
        a0_1.field_0 = aVar18;
        local_128._0_4_ = fVar20;
      }
    }
    uVar14 = set->_end;
    uVar17 = uVar17 + 0x20;
  }
  fVar21 = -a0.field_0.v[1];
  fVar20 = -a0.field_0.v[2];
  auVar22._8_4_ = 0xffffffff;
  auVar22._0_8_ = 0xffffffffffffffff;
  auVar30._8_4_ = 0xffffffff;
  auVar30._0_8_ = 0xffffffffffffffff;
  if (fVar21 * fVar21 + a0.field_0.v[2] * a0.field_0.v[2] + 0.0 <=
      a0.field_0.v[0] * a0.field_0.v[0] + fVar20 * fVar20 + 0.0) {
    auVar30 = SUB1612((undefined1  [16])0x0,0);
  }
  fVar28 = (float)(a0.field_0.i[2] & auVar30._4_4_);
  fVar20 = (float)(~auVar30._0_4_ & (uint)fVar20);
  fVar27 = (float)(~auVar30._8_4_ & a0.field_0.i[0] | (uint)fVar21 & auVar30._8_4_);
  fVar21 = fVar28 * fVar28;
  fVar29 = fVar27 * fVar27;
  fVar35 = fVar21 + fVar20 * fVar20 + fVar29;
  fVar36 = fVar21 + fVar21 + 0.0;
  fVar29 = fVar21 + fVar29 + fVar29;
  fVar21 = fVar21 + 0.0 + 0.0;
  auVar37._4_4_ = fVar36;
  auVar37._0_4_ = fVar35;
  auVar37._8_4_ = fVar29;
  auVar37._12_4_ = fVar21;
  auVar7._4_4_ = fVar36;
  auVar7._0_4_ = fVar35;
  auVar7._8_4_ = fVar29;
  auVar7._12_4_ = fVar21;
  auVar24 = rsqrtss(auVar37,auVar7);
  fVar21 = auVar24._0_4_;
  fVar21 = fVar21 * 1.5 - fVar21 * fVar21 * fVar35 * 0.5 * fVar21;
  fVar20 = fVar21 * fVar20;
  fVar28 = fVar21 * fVar28;
  fVar27 = fVar21 * fVar27;
  fVar29 = fVar28 * a0.field_0.v[0] - a0.field_0.v[1] * fVar20;
  fVar35 = fVar27 * a0.field_0.v[1] - a0.field_0.v[2] * fVar28;
  fVar36 = fVar20 * a0.field_0.v[2] - a0.field_0.v[0] * fVar27;
  fVar34 = fVar21 * 0.0 * a0.field_0.v[3] - a0.field_0.v[3] * fVar21 * 0.0;
  fVar21 = fVar35 * fVar35;
  fVar33 = fVar36 * fVar36;
  fVar34 = fVar34 * fVar34;
  fVar38 = fVar33 + fVar21 + fVar29 * fVar29;
  fVar39 = fVar34 + fVar21 + fVar21;
  fVar33 = fVar33 + fVar21 + fVar33;
  fVar34 = fVar34 + fVar21 + fVar34;
  auVar31._4_4_ = fVar39;
  auVar31._0_4_ = fVar38;
  auVar31._8_4_ = fVar33;
  auVar31._12_4_ = fVar34;
  auVar9._4_4_ = fVar39;
  auVar9._0_4_ = fVar38;
  auVar9._8_4_ = fVar33;
  auVar9._12_4_ = fVar34;
  auVar24 = rsqrtss(auVar31,auVar9);
  fVar21 = auVar24._0_4_;
  fVar21 = fVar21 * 1.5 - fVar21 * fVar21 * fVar38 * 0.5 * fVar21;
  space0.vx.field_0.m128[1] = fVar21 * fVar35;
  space0.vx.field_0.m128[0] = fVar20;
  space0.vx.field_0.m128[2] = (float)a0.field_0.i[0];
  space0.vx.field_0.m128[3] = 0.0;
  space0.vy.field_0.m128[1] = fVar21 * fVar36;
  space0.vy.field_0.m128[0] = fVar28;
  space0.vy.field_0.m128[2] = (float)a0.field_0.i[1];
  space0.vy.field_0.m128[3] = 0.0;
  space0.vz.field_0.m128[1] = fVar21 * fVar29;
  space0.vz.field_0.m128[0] = fVar27;
  space0.vz.field_0.m128[2] = (float)a0.field_0.i[2];
  space0.vz.field_0.m128[3] = 0.0;
  fVar21 = -a0_1.field_0.v[1];
  fVar20 = -a0_1.field_0.v[2];
  if (fVar21 * fVar21 + a0_1.field_0.v[2] * a0_1.field_0.v[2] + 0.0 <=
      a0_1.field_0.v[0] * a0_1.field_0.v[0] + fVar20 * fVar20 + 0.0) {
    auVar22 = SUB1612((undefined1  [16])0x0,0);
  }
  fVar34 = (float)(a0_1.field_0.i[2] & auVar22._4_4_);
  fVar20 = (float)(~auVar22._0_4_ & (uint)fVar20);
  fVar27 = (float)(~auVar22._8_4_ & a0_1.field_0.i[0] | (uint)fVar21 & auVar22._8_4_);
  fVar21 = fVar34 * fVar34;
  fVar28 = fVar27 * fVar27;
  fVar29 = fVar21 + fVar20 * fVar20 + fVar28;
  fVar35 = fVar21 + fVar21 + 0.0;
  fVar28 = fVar21 + fVar28 + fVar28;
  fVar21 = fVar21 + 0.0 + 0.0;
  auVar32._4_4_ = fVar35;
  auVar32._0_4_ = fVar29;
  auVar32._8_4_ = fVar28;
  auVar32._12_4_ = fVar21;
  auVar6._4_4_ = fVar35;
  auVar6._0_4_ = fVar29;
  auVar6._8_4_ = fVar28;
  auVar6._12_4_ = fVar21;
  auVar24 = rsqrtss(auVar32,auVar6);
  fVar21 = auVar24._0_4_;
  fVar28 = fVar21 * 1.5 - fVar21 * fVar21 * fVar29 * 0.5 * fVar21;
  fVar20 = fVar28 * fVar20;
  fVar34 = fVar28 * fVar34;
  fVar27 = fVar28 * fVar27;
  fVar21 = fVar34 * a0_1.field_0.v[0] - a0_1.field_0.v[1] * fVar20;
  fVar29 = fVar27 * a0_1.field_0.v[1] - a0_1.field_0.v[2] * fVar34;
  fVar35 = fVar20 * a0_1.field_0.v[2] - a0_1.field_0.v[0] * fVar27;
  fVar33 = fVar28 * 0.0 * a0_1.field_0.v[3] - a0_1.field_0.v[3] * fVar28 * 0.0;
  fVar28 = fVar29 * fVar29;
  fVar36 = fVar35 * fVar35;
  fVar33 = fVar33 * fVar33;
  fVar38 = fVar36 + fVar28 + fVar21 * fVar21;
  fVar39 = fVar33 + fVar28 + fVar28;
  fVar36 = fVar36 + fVar28 + fVar36;
  fVar33 = fVar33 + fVar28 + fVar33;
  auVar25._4_4_ = fVar39;
  auVar25._0_4_ = fVar38;
  auVar25._8_4_ = fVar36;
  auVar25._12_4_ = fVar33;
  auVar8._4_4_ = fVar39;
  auVar8._0_4_ = fVar38;
  auVar8._8_4_ = fVar36;
  auVar8._12_4_ = fVar33;
  auVar24 = rsqrtss(auVar25,auVar8);
  fVar28 = auVar24._0_4_;
  fVar28 = fVar28 * 1.5 - fVar28 * fVar28 * fVar38 * 0.5 * fVar28;
  space1.vx.field_0.m128[1] = fVar28 * fVar29;
  space1.vx.field_0.m128[0] = fVar20;
  space1.vx.field_0.m128[2] = (float)a0_1.field_0.i[0];
  space1.vx.field_0.m128[3] = 0.0;
  space1.vy.field_0.m128[1] = fVar28 * fVar35;
  space1.vy.field_0.m128[0] = fVar34;
  space1.vy.field_0.m128[2] = (float)a0_1.field_0.i[1];
  space1.vy.field_0.m128[3] = 0.0;
  space1.vz.field_0.m128[1] = fVar28 * fVar21;
  space1.vz.field_0.m128[0] = fVar27;
  space1.vz.field_0.m128[2] = (float)a0_1.field_0.i[2];
  space1.vz.field_0.m128[3] = 0.0;
  uVar13 = set->_begin;
  uVar16 = uVar13 << 5 | 0x1c;
  local_100 = 0;
  uStack_d0 = 0x7f8000007f800000;
  local_d8 = (undefined1  [8])0x7f8000007f800000;
  uStack_f0 = 0x7f8000007f800000;
  local_f8 = (undefined1  [8])0x7f8000007f800000;
  _local_128 = _DAT_01f45a40;
  _local_e8 = _DAT_01f45a40;
  lVar15 = 0;
  for (; uVar13 < set->_end; uVar13 = uVar13 + 1) {
    pPVar4 = this->prims;
    pGVar3 = (this->scene->geometries).items[*(uint *)((long)pPVar4 + (uVar16 - 0x10))].ptr;
    (*(pGVar3->super_RefCount)._vptr_RefCount[0x37])
              (&local_b8,pGVar3,(ulong)*(uint *)((long)&(pPVar4->lower).field_0 + uVar16));
    fVar20 = fStack_b4 * fStack_b4;
    fVar21 = fStack_b0 * fStack_b0;
    fVar28 = fStack_ac * fStack_ac;
    fVar29 = fVar20 + local_b8 * local_b8 + fVar21;
    auVar26._0_8_ = CONCAT44(fVar20 + fVar20 + fVar28,fVar29);
    auVar26._8_4_ = fVar20 + fVar21 + fVar21;
    auVar26._12_4_ = fVar20 + fVar28 + fVar28;
    auVar19._8_4_ = auVar26._8_4_;
    auVar19._0_8_ = auVar26._0_8_;
    auVar19._12_4_ = auVar26._12_4_;
    auVar24 = rsqrtss(auVar19,auVar26);
    fVar20 = auVar24._0_4_;
    fVar20 = fVar20 * fVar20 * fVar29 * -0.5 * fVar20 + fVar20 * 1.5;
    if (ABS(a0.field_0.v[2] * fVar20 * fStack_b0 +
            a0.field_0.v[1] * fVar20 * fStack_b4 + a0.field_0.v[0] * fVar20 * local_b8) <=
        ABS(fVar20 * fStack_b0 * a0_1.field_0.v[2] +
            fVar20 * fStack_b4 * a0_1.field_0.v[1] + fVar20 * local_b8 * a0_1.field_0.v[0])) {
      local_100 = local_100 + 1;
      pGVar3 = (this->scene->geometries).items[*(uint *)((long)pPVar4 + (uVar16 - 0x10))].ptr;
      (*(pGVar3->super_RefCount)._vptr_RefCount[0x3a])
                (&local_b8,pGVar3,&space1,(ulong)*(uint *)((long)&(pPVar4->lower).field_0 + uVar16))
      ;
      auVar11._4_4_ = fStack_b4;
      auVar11._0_4_ = local_b8;
      auVar11._8_4_ = fStack_b0;
      auVar11._12_4_ = fStack_ac;
      _local_d8 = minps(_local_d8,auVar11);
      _local_128 = maxps(_local_128,local_a8);
    }
    else {
      lVar15 = lVar15 + 1;
      pGVar3 = (this->scene->geometries).items[*(uint *)((long)pPVar4 + (uVar16 - 0x10))].ptr;
      (*(pGVar3->super_RefCount)._vptr_RefCount[0x3a])
                (&local_b8,pGVar3,&space0,(ulong)*(uint *)((long)&(pPVar4->lower).field_0 + uVar16))
      ;
      auVar10._4_4_ = fStack_b4;
      auVar10._0_4_ = local_b8;
      auVar10._8_4_ = fStack_b0;
      auVar10._12_4_ = fStack_ac;
      _local_f8 = minps(_local_f8,auVar10);
      _local_e8 = maxps(_local_e8,local_a8);
    }
    uVar16 = uVar16 + 0x20;
  }
  if (local_100 == 0 || lVar15 == 0) {
    fVar20 = INFINITY;
  }
  else {
    bVar12 = (byte)logBlockSize;
    uVar16 = ~(-1L << (bVar12 & 0x3f));
    fVar20 = (float)(lVar15 + uVar16 >> (bVar12 & 0x3f)) *
             ((((float)local_e8._4_4_ - (float)local_f8._4_4_) + (fStack_e0 - (float)uStack_f0)) *
              ((float)local_e8._0_4_ - (float)local_f8._0_4_) +
             (fStack_e0 - (float)uStack_f0) * ((float)local_e8._4_4_ - (float)local_f8._4_4_)) +
             ((((float)local_128._4_4_ - (float)local_d8._4_4_) + (fStack_120 - (float)uStack_d0)) *
              ((float)local_128._0_4_ - (float)local_d8._0_4_) +
             (fStack_120 - (float)uStack_d0) * ((float)local_128._4_4_ - (float)local_d8._4_4_)) *
             (float)(local_100 + uVar16 >> (bVar12 & 0x3f));
  }
  __return_storage_ptr__->sah = fVar20;
  *(ulong *)&(__return_storage_ptr__->axis0).field_0 = CONCAT44(a0.field_0.i[1],a0.field_0.i[0]);
  *(ulong *)((long)&(__return_storage_ptr__->axis0).field_0 + 8) =
       CONCAT44(a0.field_0.i[3],a0.field_0.i[2]);
  *(undefined8 *)&(__return_storage_ptr__->axis1).field_0 = a0_1.field_0._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->axis1).field_0 + 8) = a0_1.field_0._8_8_;
  return __return_storage_ptr__;
}

Assistant:

const Split find(const range<size_t>& set, size_t logBlockSize)
      {
        Vec3fa axis0(0,0,1);
        uint64_t bestGeomPrimID = -1;

        /* curve with minimum ID determines first axis */
        for (size_t i=set.begin(); i<set.end(); i++)
        {
          const uint64_t geomprimID = prims[i].ID64();
          if (geomprimID >= bestGeomPrimID) continue;
          const Vec3fa axis = direction(prims[i]);
          if (sqr_length(axis) > 1E-18f) {
            axis0 = normalize(axis);
            bestGeomPrimID = geomprimID;
          }
        }
      
        /* find 2nd axis that is most misaligned with first axis and has minimum ID */
        float bestCos = 1.0f;
        Vec3fa axis1 = axis0;
        bestGeomPrimID = -1;
        for (size_t i=set.begin(); i<set.end(); i++) 
        {
          const uint64_t geomprimID = prims[i].ID64();
          Vec3fa axisi = direction(prims[i]);
          float leni = length(axisi);
          if (leni == 0.0f) continue;
          axisi /= leni;
          float cos = abs(dot(axisi,axis0));
          if ((cos == bestCos && (geomprimID < bestGeomPrimID)) || cos < bestCos) {
            bestCos = cos; axis1 = axisi;
            bestGeomPrimID = geomprimID;
          }
        }
      
        /* partition the two strands */
        size_t lnum = 0, rnum = 0;
        BBox3fa lbounds = empty, rbounds = empty;
        const LinearSpace3fa space0 = frame(axis0).transposed();
        const LinearSpace3fa space1 = frame(axis1).transposed();
        
        for (size_t i=set.begin(); i<set.end(); i++)
        {
          PrimRef& prim = prims[i];
          const Vec3fa axisi = normalize(direction(prim));
          const float cos0 = abs(dot(axisi,axis0));
          const float cos1 = abs(dot(axisi,axis1));
          
          if (cos0 > cos1) { lnum++; lbounds.extend(bounds(space0,prim)); }
          else             { rnum++; rbounds.extend(bounds(space1,prim)); }
        }
      
        /*! return an invalid split if we do not partition */
        if (lnum == 0 || rnum == 0) 
          return Split(inf,axis0,axis1);
      
        /*! calculate sah for the split */
        const size_t lblocks = (lnum+(1ull<<logBlockSize)-1ull) >> logBlockSize;
        const size_t rblocks = (rnum+(1ull<<logBlockSize)-1ull) >> logBlockSize;
        const float sah = madd(float(lblocks),halfArea(lbounds),float(rblocks)*halfArea(rbounds));
        return Split(sah,axis0,axis1);
      }